

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SkipList.cpp
# Opt level: O2

void duckdb_skiplistlib::skip_list::_throw_exceeds_size(size_t param_1)

{
  IndexError *this;
  allocator local_31;
  string err_msg;
  
  std::__cxx11::string::string((string *)&err_msg,"Index out of range.",&local_31);
  this = (IndexError *)__cxa_allocate_exception(0x28);
  IndexError::IndexError(this,&err_msg);
  __cxa_throw(this,&IndexError::typeinfo,Exception::~Exception);
}

Assistant:

void _throw_exceeds_size(size_t /* index */) {
    std::string err_msg = "Index out of range.";
#endif
    throw IndexError(err_msg);
}